

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ClosePopupToLevel(int remaining)

{
  ImGuiContext *pIVar1;
  value_type *pvVar2;
  ImGuiContext *g;
  int remaining_local;
  
  pIVar1 = GImGui;
  if (remaining < 1) {
    pvVar2 = ImVector<ImGuiPopupRef>::operator[](&GImGui->OpenPopupStack,0);
    ImGui::FocusWindow(pvVar2->ParentWindow);
  }
  else {
    pvVar2 = ImVector<ImGuiPopupRef>::operator[](&GImGui->OpenPopupStack,remaining + -1);
    ImGui::FocusWindow(pvVar2->Window);
  }
  ImVector<ImGuiPopupRef>::resize(&pIVar1->OpenPopupStack,remaining);
  return;
}

Assistant:

static void ClosePopupToLevel(int remaining)
{
    ImGuiContext& g = *GImGui;
    if (remaining > 0)
        ImGui::FocusWindow(g.OpenPopupStack[remaining-1].Window);
    else
        ImGui::FocusWindow(g.OpenPopupStack[0].ParentWindow);
    g.OpenPopupStack.resize(remaining);
}